

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerTest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  size_type *__str;
  bool bVar1;
  runtime_error *prVar2;
  ulong uVar3;
  double dVar4;
  allocator local_2a5;
  int local_2a4;
  double local_2a0;
  string arg;
  queue<json::JsonTokenType,_std::deque<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>_>
  types;
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  values;
  string local_1d0;
  istringstream test;
  
  if (argc < 3) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Provide sufficient arguments");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&types,argv[1],(allocator *)&values);
  std::__cxx11::istringstream::istringstream((istringstream *)&test,(string *)&types,_S_in);
  std::__cxx11::string::~string((string *)&types);
  std::
  queue<json::JsonTokenType,std::deque<json::JsonTokenType,std::allocator<json::JsonTokenType>>>::
  queue<std::deque<json::JsonTokenType,std::allocator<json::JsonTokenType>>,void>(&types);
  std::
  queue<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::queue<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>(&values);
  for (uVar3 = 2; uVar3 < (uint)argc; uVar3 = uVar3 + 2) {
    std::__cxx11::string::string((string *)&arg,argv[uVar3],(allocator *)&local_1d0);
    bVar1 = std::operator==(&arg,"TYPE");
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_1d0,argv[uVar3 + 1],&local_2a5);
      local_2a4 = std::__cxx11::stoi(&local_1d0,(size_t *)0x0,10);
      std::deque<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>::
      emplace_back<json::JsonTokenType>(&types.c,(JsonTokenType *)&local_2a4);
    }
    else {
      bVar1 = std::operator==(&arg,"VALUE");
      if (!bVar1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"Invalid test arguments");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::string((string *)&local_1d0,argv[uVar3 + 1],(allocator *)&local_2a4);
      std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&values,
                 &local_1d0);
    }
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&arg);
  }
  __str = &arg._M_string_length;
  while( true ) {
    json::JsonLexer::nextToken((JsonToken *)&arg,(istream *)&test);
    if ((types.c.super__Deque_base<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_cur ==
         types.c.super__Deque_base<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>.
         _M_impl.super__Deque_impl_data._M_start._M_cur) ||
       (*types.c.super__Deque_base<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>.
         _M_impl.super__Deque_impl_data._M_start._M_cur != (JsonTokenType)arg._M_dataplus._M_p))
    break;
    std::deque<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>::pop_front(&types.c);
    if ((JsonTokenType)arg._M_dataplus._M_p == Number) {
      if (values.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          values.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        local_2a0 = std::__cxx11::stod(values.c.
                                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_cur,(size_t *)0x0
                                      );
        dVar4 = std::__cxx11::stod((string *)__str,(size_t *)0x0);
        if ((local_2a0 == dVar4) && (!NAN(local_2a0) && !NAN(dVar4))) {
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_front(&values.c);
          goto LAB_0010255d;
        }
      }
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Wrong number value");
      goto LAB_00102627;
    }
    if ((JsonTokenType)arg._M_dataplus._M_p == EndOfFile) {
      std::__cxx11::string::~string((string *)__str);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque(&values.c);
      std::_Deque_base<json::JsonTokenType,_std::allocator<json::JsonTokenType>_>::~_Deque_base
                ((_Deque_base<json::JsonTokenType,_std::allocator<json::JsonTokenType>_> *)&types);
      std::__cxx11::istringstream::~istringstream((istringstream *)&test);
      return 0;
    }
LAB_0010255d:
    if ((JsonTokenType)arg._M_dataplus._M_p == String) {
      if (values.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          values.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        bVar1 = std::operator!=(values.c.
                                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_cur,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__str);
        if (!bVar1) {
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_front(&values.c);
          goto LAB_00102588;
        }
      }
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Wrong string value");
      goto LAB_00102627;
    }
LAB_00102588:
    std::__cxx11::string::~string((string *)__str);
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"Wrong token type");
LAB_00102627:
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char **argv)
{
    if (argc < 3)
        throw std::runtime_error("Provide sufficient arguments");

    std::istringstream test(argv[1]);
    std::queue<JsonTokenType> types;
    std::queue<std::string> values;

    // Read the correct types and values the lexer should generate when reading the JSON text.
    for (int i = 2; i < argc; i += 2)
    {
        std::string arg = argv[i];
        if (arg == "TYPE")
        {
            types.push(static_cast<JsonTokenType>(std::stoi(argv[i + 1])));
        }
        else if (arg == "VALUE")
        {
            values.push(argv[i + 1]);
        }
        else
        {
            throw std::runtime_error("Invalid test arguments");
        }
    }

    while (true)
    {
        JsonToken current = JsonLexer::nextToken(test);

        // Check that the lexer generated the correct type.
        if (types.empty() || types.front() != current.type)
            throw std::runtime_error("Wrong token type");
        types.pop();

        if (current.type == JsonTokenType::EndOfFile)
            break;

        if (current.type == JsonTokenType::Number)
        {
            // Check that the lexer generated the correct number.
            if (values.empty() || std::stod(values.front()) != std::stod(current.value))
                throw std::runtime_error("Wrong number value");
            values.pop();
        }

        if (current.type == JsonTokenType::String)
        {
            // Check that the lexer generated the correct string.
            if (values.empty() || values.front() != current.value)
                throw std::runtime_error("Wrong string value");
            values.pop();
        }
    }

    return 0;
}